

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

void Cnf_CollectLeaves_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fStopCompl)

{
  void **ppvVar1;
  ulong uVar2;
  ulong uVar3;
  
  do {
    if (pObj != pRoot) {
      if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
        if (fStopCompl == 0) {
          pObj = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
        }
LAB_004409c1:
        uVar3 = 0;
        uVar2 = (ulong)(uint)vSuper->nSize;
        if (vSuper->nSize < 1) {
          uVar2 = uVar3;
        }
        do {
          if (uVar2 == uVar3) {
            Vec_PtrPush(vSuper,pObj);
            return;
          }
          ppvVar1 = vSuper->pArray + uVar3;
          uVar3 = uVar3 + 1;
        } while ((Aig_Obj_t *)*ppvVar1 != pObj);
        return;
      }
      if ((fStopCompl != 0) && (((ulong)pObj & 1) != 0)) goto LAB_004409c1;
    }
    if (((uint)*(ulong *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                    ,0x34,"void Cnf_CollectLeaves_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if (fStopCompl == 0) {
      Cnf_CollectLeaves_rec(pRoot,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSuper,0)
      ;
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    }
    else {
      Cnf_CollectLeaves_rec(pRoot,pObj->pFanin0,vSuper,1);
      pObj = pObj->pFanin1;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Detects multi-input gate rooted at this node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CollectLeaves_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fStopCompl )
{
    if ( pRoot != pObj && (pObj->fMarkA || (fStopCompl && Aig_IsComplement(pObj))) )
    {
        Vec_PtrPushUnique( vSuper, fStopCompl ? pObj : Aig_Regular(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( fStopCompl )
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild0(pObj), vSuper, 1 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild1(pObj), vSuper, 1 );
    }
    else
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin0(pObj), vSuper, 0 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin1(pObj), vSuper, 0 );
    }
}